

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O3

int __thiscall rlist::match(rlist *this,void *ptr,void *key)

{
  size_t __n;
  uint uVar1;
  int iVar2;
  
  __n = (*(undefined8 **)((long)ptr + 0x10))[1];
  uVar1 = 0;
  if (__n == *(size_t *)((long)key + 8)) {
    if (__n == 0) {
      return 1;
    }
    iVar2 = bcmp((void *)**(undefined8 **)((long)ptr + 0x10),*key,__n);
    uVar1 = (uint)(iVar2 == 0);
  }
  return uVar1;
}

Assistant:

int rlist::match(void *ptr,void *key){
    return (*(static_cast<std::string*>(((listNode *)ptr)->value))==*(static_cast<std::string*>(key)))?1:0;
}